

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O2

void __thiscall AixLog::Function::~Function(Function *this)

{
  ~Function(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

virtual ~Function() = default;